

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall
cs::domain_manager::add_var_no_return<char_const(&)[7]>
          (domain_manager *this,char (*name) [7],var *val,bool is_override)

{
  bool bVar1;
  undefined8 uVar2;
  domain_type *val_00;
  string *str;
  byte in_CL;
  runtime_error *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_fffffffffffffe38;
  runtime_error *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 in_stack_fffffffffffffe57;
  var *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  runtime_error *prVar3;
  domain_type *in_stack_fffffffffffffe68;
  domain_type *this_00;
  stack_type<cs::domain_type,_std::allocator> *in_stack_fffffffffffffe80;
  allocator *paVar4;
  undefined1 local_149 [104];
  undefined1 local_e1 [39];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [119];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  runtime_error *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  if (*(long *)*in_RDI == 0) {
    val_00 = stack_type<cs::domain_type,_std::allocator>::top(in_stack_fffffffffffffe80);
    this_00 = (domain_type *)local_e1;
    prVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_e1 + 1),(char *)prVar3,(allocator *)this_00);
    bVar1 = domain_type::add_var_optimal
                      (this_00,(string *)prVar3,(var *)val_00,(bool)in_stack_fffffffffffffe57);
    std::__cxx11::string::~string((string *)(local_e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      str = (string *)__cxa_allocate_exception(0x28);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_149;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_149 + 1),(char *)local_10,(allocator *)__lhs);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
      std::operator+(__lhs,(char *)local_10);
      runtime_error::runtime_error(local_10,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_fffffffffffffe80);
    prVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,(char *)prVar3,&local_41);
    bVar1 = domain_type::add_var_optimal
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58
                       ,(bool)in_stack_fffffffffffffe57);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_ba = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      paVar4 = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,(char *)local_10,paVar4);
      std::operator+((char *)in_stack_fffffffffffffe48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40);
      std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
      runtime_error::runtime_error(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      local_ba = 0;
      __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val, bool is_override)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}